

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

void initMatchList(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **oDep,Vec_Int_t **iMatch,
                  int *iLastItem,Vec_Int_t **oMatch,int *oLastItem,int *iGroup,int *oGroup,
                  int p_equivalence)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  bool bVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  
  if (p_equivalence == 0) {
    iVar9 = pNtk->vPis->nSize;
    pvVar5 = malloc((long)(int)(iVar9 + 1U) << 3);
    if (-1 < iVar9) {
      uVar10 = 0;
      do {
        pvVar6 = calloc(1,0x10);
        *(void **)((long)pvVar5 + uVar10 * 8) = pvVar6;
        uVar10 = uVar10 + 1;
      } while (iVar9 + 1U != uVar10);
    }
    if (0 < pNtk->vPos->nSize) {
      lVar8 = 0;
      do {
        Vec_IntPush(*(Vec_Int_t **)((long)pvVar5 + (long)oDep[lVar8]->nSize * 8),(int)lVar8);
        lVar8 = lVar8 + 1;
      } while (lVar8 < pNtk->vPos->nSize);
      iVar9 = pNtk->vPis->nSize;
    }
    if (iVar9 < 0) {
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      lVar8 = 0;
      do {
        pVVar2 = *(Vec_Int_t **)((long)pvVar5 + lVar8 * 8);
        iVar1 = pVVar2->nSize;
        if (iVar1 == 0) {
          if (pVVar2->pArray != (int *)0x0) {
            free(pVVar2->pArray);
          }
          free(pVVar2);
        }
        else {
          oMatch[iVar9] = pVVar2;
          if (0 < iVar1) {
            piVar3 = pVVar2->pArray;
            lVar7 = 0;
            do {
              oGroup[piVar3[lVar7]] = iVar9;
              lVar7 = lVar7 + 1;
            } while (lVar7 < pVVar2->nSize);
          }
          iVar9 = iVar9 + 1;
        }
        bVar4 = lVar8 < pNtk->vPis->nSize;
        lVar8 = lVar8 + 1;
      } while (bVar4);
    }
    *oLastItem = iVar9;
    if (pvVar5 != (void *)0x0) {
      free(pvVar5);
    }
  }
  else if (0 < pNtk->vPos->nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(oMatch[lVar8],(int)lVar8);
      oGroup[lVar8] = (int)lVar8;
      iVar9 = pNtk->vPos->nSize;
      *oLastItem = iVar9;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar9);
  }
  iVar9 = pNtk->vPos->nSize;
  pvVar5 = malloc((long)(int)(iVar9 + 1U) << 3);
  if (-1 < iVar9) {
    uVar10 = 0;
    do {
      pvVar6 = calloc(1,0x10);
      *(void **)((long)pvVar5 + uVar10 * 8) = pvVar6;
      uVar10 = uVar10 + 1;
    } while (iVar9 + 1U != uVar10);
  }
  if (0 < pNtk->vPis->nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(*(Vec_Int_t **)((long)pvVar5 + (long)iDep[lVar8]->nSize * 8),(int)lVar8);
      lVar8 = lVar8 + 1;
    } while (lVar8 < pNtk->vPis->nSize);
    iVar9 = pNtk->vPos->nSize;
  }
  if (iVar9 < 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    lVar8 = 0;
    do {
      pVVar2 = *(Vec_Int_t **)((long)pvVar5 + lVar8 * 8);
      iVar1 = pVVar2->nSize;
      if (iVar1 == 0) {
        if (pVVar2->pArray != (int *)0x0) {
          free(pVVar2->pArray);
        }
        free(pVVar2);
      }
      else {
        iMatch[iVar9] = pVVar2;
        if (0 < iVar1) {
          piVar3 = pVVar2->pArray;
          lVar7 = 0;
          do {
            iGroup[piVar3[lVar7]] = iVar9;
            lVar7 = lVar7 + 1;
          } while (lVar7 < pVVar2->nSize);
        }
        iVar9 = iVar9 + 1;
      }
      bVar4 = lVar8 < pNtk->vPos->nSize;
      lVar8 = lVar8 + 1;
    } while (bVar4);
  }
  *iLastItem = iVar9;
  if (pvVar5 == (void *)0x0) {
    return;
  }
  free(pvVar5);
  return;
}

Assistant:

void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence)
{
    int i, j, curr;
    Vec_Int_t** temp;

    if(!p_equivalence) {
        temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPiNum(pNtk)+1);

        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)    
            temp[i] = Vec_IntAlloc( 0 );    

        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)        
            Vec_IntPush(temp[Vec_IntSize(oDep[i])], i);

        curr = 0;
        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)
        {
            if(Vec_IntSize(temp[i]) == 0)
                Vec_IntFree( temp[i] );

            else
            {
                oMatch[curr] = temp[i];
                
                for(j = 0; j < Vec_IntSize(temp[i]); j++)
                    oGroup[Vec_IntEntry(oMatch[curr], j)] = curr;
            
                curr++;
            }
        }

        *oLastItem = curr;

        ABC_FREE( temp );
    }
    else {
        // the else part fixes the outputs for P-equivalence checking
        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        {
            Vec_IntPush(oMatch[i], i);
            oGroup[i] = i;
            (*oLastItem) = Abc_NtkPoNum(pNtk);
        }
    }
        
    /*for(j = 0; j < *oLastItem; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        printf("%d: %d ", i, oGroup[i]);*/

    //////////////////////////////////////////////////////////////////////////////

    temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPoNum(pNtk)+1 );

    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)    
        temp[i] = Vec_IntAlloc( 0 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)        
        Vec_IntPush(temp[Vec_IntSize(iDep[i])], i);

    curr = 0;
    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)
    {
        if(Vec_IntSize(temp[i]) == 0)
            Vec_IntFree( temp[i] );
        else
        {
            iMatch[curr] = temp[i];
            for(j = 0; j < Vec_IntSize(iMatch[curr]); j++)
                iGroup[Vec_IntEntry(iMatch[curr], j)] = curr;
            curr++;
        }        
    }

    *iLastItem = curr;

    ABC_FREE( temp );        

    /*printf("\n");
    for(j = 0; j < *iLastItem; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
        printf("%d: %d ", i, iGroup[i]);
    printf("\n");*/
}